

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O0

Resource * __thiscall tcu::ResourcePrefix::getResource(ResourcePrefix *this,char *name)

{
  Archive *pAVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *name_local;
  ResourcePrefix *this_local;
  
  pAVar1 = this->m_archive;
  local_18 = name;
  name_local = (char *)this;
  std::operator+(&local_38,&this->m_prefix,name);
  uVar3 = std::__cxx11::string::c_str();
  iVar2 = (*pAVar1->_vptr_Archive[2])(pAVar1,uVar3);
  std::__cxx11::string::~string((string *)&local_38);
  return (Resource *)CONCAT44(extraout_var,iVar2);
}

Assistant:

Resource* ResourcePrefix::getResource (const char* name) const
{
	return m_archive.getResource((m_prefix + name).c_str());
}